

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_stop_map(Parser *this)

{
  Tree *pTVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  code *pcVar5;
  Location LVar6;
  undefined1 auVar7 [24];
  Location LVar8;
  Location LVar9;
  bool bVar10;
  char msg [49];
  char local_88 [24];
  char *pcStack_70;
  char local_68 [40];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  pTVar1 = this->m_tree;
  uVar2 = this->m_state->node_id;
  if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = -0x7a;
    local_88[9] = 'K';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    pcStack_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_68[0] = 'e';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[uVar2].m_type.type & MAP) == NOTYPE) {
    builtin_strncpy(local_68,"state->node_id))",0x11);
    builtin_strncpy(local_88 + 0x10,"_tree->i",8);
    pcStack_70 = (char *)0x5f6d2870616d5f73;
    builtin_strncpy(local_88,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    local_40 = 0;
    uStack_38 = 0x786e;
    local_30 = 0;
    pcStack_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_20 = 0x65;
    auVar7 = ZEXT1224(ZEXT412(0x786e) << 0x40);
    LVar6.name.str._0_4_ = 0x1f8f8a;
    LVar6.super_LineCol.offset = auVar7._0_8_;
    LVar6.super_LineCol.line = auVar7._8_8_;
    LVar6.super_LineCol.col = auVar7._16_8_;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_88,0x31,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((this->m_state->flags & 0x260U) == 0x60) {
    pcVar3 = (this->m_state->line_contents).rem.str;
    pcVar4 = (this->m_buf).str;
    if ((pcVar3 < pcVar4) || (pcVar4 + (this->m_buf).len < pcVar3)) {
      builtin_strncpy(local_68,"n() && str <= m_buf.end())",0x1b);
      builtin_strncpy(local_88 + 0x10,"tr >= m_",8);
      pcStack_70 = (char *)0x696765622e667562;
      builtin_strncpy(local_88,"check failed: (s",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar10 = is_debugger_attached();
        if (bVar10) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      auVar7 = ZEXT1224(ZEXT412(0x5e97) << 0x40);
      LVar8.name.str._0_4_ = 0x1f8f8a;
      LVar8.super_LineCol.offset = auVar7._0_8_;
      LVar8.super_LineCol.line = auVar7._8_8_;
      LVar8.super_LineCol.col = auVar7._16_8_;
      LVar8.name.str._4_4_ = 0;
      LVar8.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_88,0x3b,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    _store_scalar(this,(csubstr)ZEXT816(0),0);
    pcVar3 = (this->m_state->line_contents).rem.str;
    pcVar4 = (this->m_buf).str;
    if ((pcVar3 < pcVar4) || (pcVar4 + (this->m_buf).len < pcVar3)) {
      builtin_strncpy(local_68,"n() && str <= m_buf.end())",0x1b);
      builtin_strncpy(local_88 + 0x10,"tr >= m_",8);
      pcStack_70 = (char *)0x696765622e667562;
      builtin_strncpy(local_88,"check failed: (s",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar10 = is_debugger_attached();
        if (bVar10) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      auVar7 = ZEXT1224(ZEXT412(0x5e96) << 0x40);
      LVar9.name.str._0_4_ = 0x1f8f8a;
      LVar9.super_LineCol.offset = auVar7._0_8_;
      LVar9.super_LineCol.line = auVar7._8_8_;
      LVar9.super_LineCol.col = auVar7._16_8_;
      LVar9.name.str._4_4_ = 0;
      LVar9.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_88,0x3b,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
    _append_key_val(this,(csubstr)ZEXT816(0),0);
  }
  return;
}

Assistant:

void Parser::_stop_map()
{
    _c4dbgpf("stop_map[{}]", m_state->node_id);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(m_state->node_id));
    if(has_all(QMRK|RKEY) && !has_all(SSCL))
    {
        _c4dbgpf("stop_map[{}]: RKEY", m_state->node_id);
        _store_scalar_null(m_state->line_contents.rem.str);
        _append_key_val_null(m_state->line_contents.rem.str);
    }
}